

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  size_type *psVar7;
  Result *_result;
  undefined1 *from;
  long lVar8;
  uint64_t uVar9;
  long lVar10;
  InternalMetadata *pIVar11;
  undefined1 *puVar12;
  string err;
  UniDirectionalLSTMLayerParams recurrent;
  string local_108;
  string local_e8;
  uint64_t local_c8;
  undefined1 local_c0 [40];
  LSTMParams *local_98;
  LSTMWeightParams *local_90;
  uint64_t local_88;
  uint64_t local_80;
  string local_70;
  LSTMParams local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,3);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,3,3);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UniDirectionalLSTM","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"UniDirectionalLSTM","");
    validateRankCount(__return_storage_ptr__,layer,(string *)local_c0,5,5,&this->blobNameToRank);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar12 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar12 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar11 = &(((BatchnormLayerParams *)puVar12)->mean_->super_MessageLite)._internal_metadata_;
  if (((BatchnormLayerParams *)puVar12)->mean_ == (WeightParams *)0x0) {
    pIVar11 = (InternalMetadata *)0x0;
  }
  lVar8 = (long)*(int *)&(((ConvolutionLayerParams *)puVar12)->kernelsize_).arena_or_elements_;
  bVar4 = lVar8 == 0;
  if (!bVar4) {
    lVar10 = 0;
    do {
      validateRecurrentActivationParams
                (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar11->ptr_ + lVar10));
      bVar5 = Result::good(__return_storage_ptr__);
      if (!bVar5) {
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        break;
      }
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 8;
      bVar4 = lVar8 * 8 == lVar10;
    } while (!bVar4);
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar12 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar12 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  from = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar12)->params_;
  puVar12 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar12)->weightparams_;
  if ((LSTMWeightParams *)puVar12 == (LSTMWeightParams *)0x0) {
    puVar12 = Specification::_LSTMWeightParams_default_instance_;
  }
  if ((LSTMParams *)from == (LSTMParams *)0x0) {
    from = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,(LSTMParams *)from);
  validateLSTMWeightParams(__return_storage_ptr__,(LSTMWeightParams *)puVar12,&local_50);
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar12 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar12 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)local_c0,(UniDirectionalLSTMLayerParams *)puVar12);
  if (local_c0._24_4_ == 3) {
    puVar12 = (undefined1 *)local_90;
    if (local_90 == (LSTMWeightParams *)0x0) {
      puVar12 = Specification::_LSTMWeightParams_default_instance_;
    }
    local_c8 = local_80;
    puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->inputgateweightmatrix_;
    if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
      puVar12 = Specification::_WeightParams_default_instance_;
    }
    uVar9 = local_88 * local_80;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Unidirectional LSTM","");
    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"input gate weight matrix","");
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
               (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      puVar12 = (undefined1 *)local_90;
      if (local_90 == (LSTMWeightParams *)0x0) {
        puVar12 = Specification::_LSTMWeightParams_default_instance_;
      }
      puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->forgetgateweightmatrix_;
      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
        puVar12 = Specification::_WeightParams_default_instance_;
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Unidirectional LSTM","")
      ;
      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"forget gate weight matrix","");
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
                 (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        puVar12 = (undefined1 *)local_90;
        if (local_90 == (LSTMWeightParams *)0x0) {
          puVar12 = Specification::_LSTMWeightParams_default_instance_;
        }
        puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->blockinputweightmatrix_;
        if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
          puVar12 = Specification::_WeightParams_default_instance_;
        }
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Unidirectional LSTM","");
        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"block input gate weight matrix","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (bVar4) {
          pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != paVar1) {
            operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
          }
          puVar12 = (undefined1 *)local_90;
          if (local_90 == (LSTMWeightParams *)0x0) {
            puVar12 = Specification::_LSTMWeightParams_default_instance_;
          }
          puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->outputgateweightmatrix_;
          if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
            puVar12 = Specification::_WeightParams_default_instance_;
          }
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"Unidirectional LSTM","");
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"output gate weight matrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good(__return_storage_ptr__);
          if (bVar4) {
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            puVar12 = (undefined1 *)local_90;
            if (local_90 == (LSTMWeightParams *)0x0) {
              puVar12 = Specification::_LSTMWeightParams_default_instance_;
            }
            puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->inputgaterecursionmatrix_;
            if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
              puVar12 = Specification::_WeightParams_default_instance_;
            }
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Unidirectional LSTM","");
            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"input gate recursion matrix","");
            uVar9 = local_c8 * local_c8;
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (bVar4) {
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              puVar12 = (undefined1 *)local_90;
              if (local_90 == (LSTMWeightParams *)0x0) {
                puVar12 = Specification::_LSTMWeightParams_default_instance_;
              }
              puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->forgetgaterecursionmatrix_;
              if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                puVar12 = Specification::_WeightParams_default_instance_;
              }
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_108,"Unidirectional LSTM","");
              pvVar3 = (layer->name_).tagged_ptr_.ptr_;
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e8,"forget gate recursion matrix","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
                         (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good(__return_storage_ptr__);
              if (bVar4) {
                pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2 != paVar1) {
                  operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                }
                puVar12 = (undefined1 *)local_90;
                if (local_90 == (LSTMWeightParams *)0x0) {
                  puVar12 = Specification::_LSTMWeightParams_default_instance_;
                }
                puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->blockinputrecursionmatrix_;
                if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                  puVar12 = Specification::_WeightParams_default_instance_;
                }
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_108,"Unidirectional LSTM","");
                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_e8,"block input gate recursion matrix","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,&local_108,
                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good(__return_storage_ptr__);
                if (bVar4) {
                  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2 != paVar1) {
                    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                  }
                  puVar12 = (undefined1 *)local_90;
                  if (local_90 == (LSTMWeightParams *)0x0) {
                    puVar12 = Specification::_LSTMWeightParams_default_instance_;
                  }
                  puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->outputgaterecursionmatrix_;
                  if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                    puVar12 = Specification::_WeightParams_default_instance_;
                  }
                  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_108,"Unidirectional LSTM","");
                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_e8,"output gate recursion matrix","");
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar12,uVar9,local_c8,
                             &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good(__return_storage_ptr__);
                  if (bVar4) {
                    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar2 != paVar1) {
                      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                    }
                    puVar12 = (undefined1 *)local_98;
                    if (local_98 == (LSTMParams *)0x0) {
                      puVar12 = Specification::_LSTMParams_default_instance_;
                    }
                    if (((LSTMParams *)puVar12)->hasbiasvectors_ == true) {
                      puVar12 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar12 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->inputgatebiasvector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"input gate bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar12 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar12 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->forgetgatebiasvector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"forget gate bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar12 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar12 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->blockinputbiasvector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"block input bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar12 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar12 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)((LSTMWeightParams *)puVar12)->outputgatebiasvector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"output gate bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                    }
                    if (local_98 == (LSTMParams *)0x0) {
                      local_98 = (LSTMParams *)Specification::_LSTMParams_default_instance_;
                    }
                    if (local_98->haspeepholevectors_ == true) {
                      puVar12 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar12 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)
                                ((LSTMWeightParams *)puVar12)->inputgatepeepholevector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"input gate peep hole vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar12 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar12 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)
                                ((LSTMWeightParams *)puVar12)->forgetgatepeepholevector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"forget gate peep hole vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        local_90 = (LSTMWeightParams *)
                                   Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar12 = (undefined1 *)local_90->outputgatepeepholevector_;
                      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
                        puVar12 = Specification::_WeightParams_default_instance_;
                      }
                      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"Unidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"output gate peep hole vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar12,local_c8,1,
                                 &local_108,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_e8
                                );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (!bVar4) goto LAB_0035fdb1;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                    }
                    Result::Result(__return_storage_ptr__);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::operator+(&local_e8,"Unidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_108.field_2._M_allocated_capacity = *psVar7;
      local_108.field_2._8_8_ = plVar6[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar7;
      local_108._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_108._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0035fdb1:
  Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 3, 3));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate weight matrix"));

    // Check recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "block input bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate peep hole vector"));
    }

    return Result();
}